

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

void __thiscall
cmDependsFortran::ConsiderModule(cmDependsFortran *this,string *name,string *stampDir)

{
  iterator iVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string stampFile;
  string local_d8;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(((this->Internal)._M_t.
                    super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                    .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl)->
                  TargetRequires)._M_t,name);
  if ((iVar1._M_node !=
       (_Base_ptr)
       ((long)&(((this->Internal)._M_t.
                 super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                 .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl)->
               TargetRequires)._M_t + 8U)) && (iVar1._M_node[2]._M_parent == (_Base_ptr)0x0)) {
    local_80.first._M_str = (stampDir->_M_dataplus)._M_p;
    local_80.first._M_len = stampDir->_M_string_length;
    local_80.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8 = local_a0;
    local_b8 = 0;
    local_b0 = 1;
    local_a0[0] = 0x2f;
    local_68 = 1;
    local_58 = 0;
    local_48 = (name->_M_dataplus)._M_p;
    local_50 = name->_M_string_length;
    local_40 = 0;
    local_38 = 6;
    local_30 = ".stamp";
    local_28 = 0;
    views._M_len = 4;
    views._M_array = &local_80;
    local_60 = local_a8;
    cmCatViews(&local_d8,views);
    std::__cxx11::string::_M_assign((string *)(iVar1._M_node + 2));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmDependsFortran::ConsiderModule(const std::string& name,
                                      const std::string& stampDir)
{
  // Locate each required module.
  auto required = this->Internal->TargetRequires.find(name);
  if (required != this->Internal->TargetRequires.end() &&
      required->second.empty()) {
    // The module is provided by a CMake target.  It will have a stamp file.
    std::string stampFile = cmStrCat(stampDir, '/', name, ".stamp");
    required->second = stampFile;
  }
}